

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O3

civil_day __thiscall
absl::lts_20240722::time_internal::cctz::detail::next_weekday(detail *this,civil_day cd,weekday wd)

{
  weekday wVar1;
  unkuint10 Var2;
  weekday wVar3;
  long lVar4;
  weekday *pwVar5;
  weekday *pwVar6;
  fields fVar7;
  civil_day cVar8;
  civil_second local_30;
  
  local_30.f_._8_4_ = cd.f_.y._0_4_;
  local_30.f_.y = (int_least64_t)this;
  local_30.f_.ss = cd.f_.y._4_1_;
  wVar3 = get_weekday(&local_30);
  pwVar5 = &DAT_00112360;
  do {
    pwVar6 = pwVar5 + 1;
    wVar1 = *pwVar5;
    pwVar5 = pwVar6;
  } while (wVar3 != wVar1);
  lVar4 = 0;
  do {
    lVar4 = lVar4 + 0x100000000;
    wVar3 = *pwVar6;
    pwVar6 = pwVar6 + 1;
  } while (wVar3 != cd.f_._8_4_);
  fVar7 = impl::n_day((year_t)this,(month_t)cd.f_.y,(long)cd.f_.y._1_1_,lVar4 >> 0x20,cd.f_.y._2_1_,
                      cd.f_.y._3_1_,cd.f_.y._4_1_);
  Var2 = fVar7._0_10_;
  cVar8.f_.hh = '\0';
  cVar8.f_.mm = '\0';
  cVar8.f_.ss = '\0';
  cVar8.f_._13_3_ = 0;
  cVar8.f_.y = (long)Var2;
  cVar8.f_.m = (char)(Var2 >> 0x40);
  cVar8.f_.d = (char)(Var2 >> 0x48);
  return (civil_day)cVar8.f_;
}

Assistant:

CONSTEXPR_F civil_day next_weekday(civil_day cd, weekday wd) noexcept {
  CONSTEXPR_D weekday k_weekdays_forw[14] = {
      weekday::monday,    weekday::tuesday,  weekday::wednesday,
      weekday::thursday,  weekday::friday,   weekday::saturday,
      weekday::sunday,    weekday::monday,   weekday::tuesday,
      weekday::wednesday, weekday::thursday, weekday::friday,
      weekday::saturday,  weekday::sunday,
  };
  weekday base = get_weekday(cd);
  for (int i = 0;; ++i) {
    if (base == k_weekdays_forw[i]) {
      for (int j = i + 1;; ++j) {
        if (wd == k_weekdays_forw[j]) {
          return cd + (j - i);
        }
      }
    }
  }
}